

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::ShouldResend(CWallet *this)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  Chain *pCVar4;
  ulong uVar5;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[10].__d.__r & 1) == 0) {
    local_12 = false;
  }
  else {
    pCVar4 = chain((CWallet *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    uVar5 = (**(code **)(*(long *)pCVar4 + 0x110))();
    if ((uVar5 & 1) == 0) {
      local_12 = false;
    }
    else {
      NodeClock::now();
      sVar2 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        (in_RDI,(time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                 (__unspec *)0x1b3f42);
      bVar3 = std::operator<(sVar2._M_value);
      if (bVar3) {
        local_12 = false;
      }
      else {
        local_12 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_12;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ShouldResend() const
{
    // Don't attempt to resubmit if the wallet is configured to not broadcast
    if (!fBroadcastTransactions) return false;

    // During reindex, importing and IBD, old wallet transactions become
    // unconfirmed. Don't resend them as that would spam other nodes.
    // We only allow forcing mempool submission when not relaying to avoid this spam.
    if (!chain().isReadyToBroadcast()) return false;

    // Do this infrequently and randomly to avoid giving away
    // that these are our transactions.
    if (NodeClock::now() < m_next_resend) return false;

    return true;
}